

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_splice_list_move_Test::TestBody(IntrusiveListTest_splice_list_move_Test *this)

{
  TestObject *__offin;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_01;
  int __fdin;
  __off64_t *in_R8;
  size_t in_R9;
  iterator iVar1;
  uint in_stack_ffffffffffffff58;
  undefined8 local_a4;
  undefined4 local_9c;
  TestObjectList local_98;
  TestObjectList local_78;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined1 local_54 [12];
  TestObjectList list1;
  
  local_98.first_ = (TestObject *)0x200000001;
  local_98.last_ = (TestObject *)CONCAT44(local_98.last_._4_4_,3);
  local_78.first_ = (TestObject *)0x0;
  local_78.last_ = (TestObject *)0x0;
  local_78.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_78,&local_98);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&list1,(IntrusiveListTest *)&local_78,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  __offin = list1.first_;
  local_a4 = 0xc800000064;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_a4);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&local_78,(IntrusiveListTest *)&local_98,data_values_00);
  __fdin = (int)&list1;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,__fdin,(__off64_t *)__offin,(int)&local_78,in_R8,in_R9,in_stack_ffffffffffffff58
            );
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  local_98.first_ = (TestObject *)0xc800000064;
  local_98.last_ = (TestObject *)0x200000001;
  local_98.size_ = CONCAT44(local_98.size_._4_4_,3);
  local_78.first_ = (TestObject *)0x0;
  local_78.last_ = (TestObject *)0x0;
  local_78.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_78,&local_98,
             (undefined1 *)((long)&local_98.size_ + 4));
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_78,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  local_a4 = 0x258000001f4;
  local_9c = 700;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_a4,&local_98);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&local_78,(IntrusiveListTest *)&local_98,data_values_01);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,__fdin,(__off64_t *)0x0,(int)&local_78,in_R8,in_R9,in_stack_ffffffffffffff58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  local_78.size_ = 0x1f400000003;
  uStack_60 = 0x2bc00000258;
  local_78.first_ = (TestObject *)0xc800000064;
  local_78.last_ = (TestObject *)0x200000001;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_78,&local_58);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_98,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  iVar1.node_ = list1.first_;
  iVar1.list_ = &list1;
  iVar1 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(iVar1,4);
  local_a4 = CONCAT44(local_a4._4_4_,400);
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_a4,(long)&local_a4 + 4);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&local_78,(IntrusiveListTest *)&local_98,data_values_02);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,(int)iVar1.list_,(__off64_t *)iVar1.node_,(int)&local_78,in_R8,in_R9,
             in_stack_ffffffffffffff58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  local_78.size_ = 0x300000190;
  uStack_60 = 0x258000001f4;
  local_78.first_ = (TestObject *)0xc800000064;
  local_78.last_ = (TestObject *)0x200000001;
  local_58 = 700;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_78,local_54);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_98,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list1);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_list_move) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  list1.splice(list1.begin(), NewList({100, 200}));
  AssertListEq(list1, {100, 200, 1, 2, 3});

  // Splice at end.
  list1.splice(list1.end(), NewList({500, 600, 700}));
  AssertListEq(list1, {100, 200, 1, 2, 3, 500, 600, 700});

  // Splice in the middle.
  list1.splice(std::next(list1.begin(), 4), NewList({400}));
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 500, 600, 700});
}